

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.c
# Opt level: O1

void golf_editor_edit_mode_geo_add_face(golf_geo_face_t face)

{
  vec_golf_geo_face_t *data;
  int *length;
  golf_geo_face_t *old_ptr_start;
  int iVar1;
  long lVar2;
  char *fmt;
  
  if (editor.in_edit_mode) {
    if ((long)(int)face.material_name._39_4_ < 3) {
      fmt = "Invalid number of points face";
    }
    else {
      lVar2 = 0;
      while ((iVar1 = *(int *)(face.material_name._31_8_ + lVar2 * 4), -1 < iVar1 &&
             (iVar1 < ((editor.edit_mode.geo)->points).length))) {
        lVar2 = lVar2 + 1;
        if ((int)face.material_name._39_4_ == lVar2) {
          data = &(editor.edit_mode.geo)->faces;
          old_ptr_start = ((editor.edit_mode.geo)->faces).data;
          length = &((editor.edit_mode.geo)->faces).length;
          iVar1 = vec_expand_((char **)data,length,&((editor.edit_mode.geo)->faces).capacity,0x90,
                              ((editor.edit_mode.geo)->faces).alloc_category);
          if (iVar1 == 0) {
            iVar1 = *length;
            *length = iVar1 + 1;
            memcpy(data->data + iVar1,&stack0x00000008,0x90);
          }
          if (data->data != old_ptr_start) {
            _golf_editor_fix_actions
                      (&data->data->active,&old_ptr_start->active,
                       &old_ptr_start[(long)*length + -1].active,(golf_editor_action_t *)0x0);
            return;
          }
          return;
        }
      }
      fmt = "Invalid point idx in face";
    }
  }
  else {
    fmt = "Editor not in edit mode";
  }
  golf_log_warning(fmt);
  return;
}

Assistant:

void golf_editor_edit_mode_geo_add_face(golf_geo_face_t face) {
    if (!editor.in_edit_mode) {
        golf_log_warning("Editor not in edit mode");
        return;
    }

    golf_geo_t *geo = editor.edit_mode.geo;
    if (face.idx.length < 3) {
        golf_log_warning("Invalid number of points face");
        return;
    }
    for (int i = 0; i < face.idx.length; i++) {
        int idx = face.idx.data[i];
        if (idx < 0 || idx >= geo->points.length) {
            golf_log_warning("Invalid point idx in face");
            return;
        }
    }
    _vec_push_and_fix_actions(&geo->faces, face, NULL);
}